

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<std::complex<float>_>::ExtractCoarse
          (TPZDohrAssembly<std::complex<float>_> *this,int isub,
          TPZFMatrix<std::complex<float>_> *global,TPZFMatrix<std::complex<float>_> *local)

{
  int iVar1;
  TPZVec<int> *this_00;
  int64_t iVar2;
  int *piVar3;
  complex<float> *pcVar4;
  TPZFMatrix<std::complex<float>_> *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  _ComplexT extraout_XMM0_Qa;
  int ic;
  int ncols;
  int ieq;
  int neq;
  TPZVec<int> *avec;
  int local_38;
  int iVar5;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 0x28),(long)in_ESI);
  iVar2 = TPZVec<int>::NElements(this_00);
  iVar1 = (int)iVar2;
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  (*(in_RCX->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(in_RCX,(long)iVar1,(long)(int)iVar2);
  for (local_38 = 0; local_38 < (int)iVar2; local_38 = local_38 + 1) {
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      piVar3 = TPZVec<int>::operator[](this_00,(long)iVar5);
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,(long)*piVar3,(long)local_38);
      pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                         (in_RCX,(int64_t)this_00,CONCAT44(iVar1,iVar5));
      pcVar4->_M_value = extraout_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}